

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalNinjaGenerator::Generate(cmGlobalNinjaGenerator *this)

{
  bool bVar1;
  PolicyStatus PVar2;
  
  OpenBuildFileStream(this);
  OpenRulesFileStream(this);
  PVar2 = cmMakefile::GetPolicyStatus
                    ((*(this->super_cmGlobalGenerator).LocalGenerators.
                       super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                       _M_impl.super__Vector_impl_data._M_start)->Makefile,CMP0058);
  this->PolicyCMP0058 = PVar2;
  this->ComputingUnknownDependencies = PVar2 < NEW;
  cmGlobalGenerator::Generate(&this->super_cmGlobalGenerator);
  WriteAssumedSourceDependencies(this);
  WriteTargetAliases(this,(ostream *)this->BuildFileStream);
  WriteUnknownExplicitDependencies(this,(ostream *)this->BuildFileStream);
  WriteBuiltinTargets(this,(ostream *)this->BuildFileStream);
  bVar1 = cmSystemTools::GetErrorOccuredFlag();
  if (bVar1) {
    std::ios::setstate((int)this->RulesFileStream +
                       (int)(this->RulesFileStream->super_ofstream).
                            super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                            [-3]);
    std::ios::setstate((int)this->BuildFileStream +
                       (int)(this->BuildFileStream->super_ofstream).
                            super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                            [-3]);
  }
  CloseCompileCommandsStream(this);
  CloseRulesFileStream(this);
  CloseBuildFileStream(this);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::Generate()
{
  this->OpenBuildFileStream();
  this->OpenRulesFileStream();

  this->PolicyCMP0058 =
    this->LocalGenerators[0]->GetMakefile()
    ->GetPolicyStatus(cmPolicies::CMP0058);
  this->ComputingUnknownDependencies =
    (this->PolicyCMP0058 == cmPolicies::OLD ||
     this->PolicyCMP0058 == cmPolicies::WARN);

  this->cmGlobalGenerator::Generate();

  this->WriteAssumedSourceDependencies();
  this->WriteTargetAliases(*this->BuildFileStream);
  this->WriteUnknownExplicitDependencies(*this->BuildFileStream);
  this->WriteBuiltinTargets(*this->BuildFileStream);

  if (cmSystemTools::GetErrorOccuredFlag()) {
    this->RulesFileStream->setstate(std::ios_base::failbit);
    this->BuildFileStream->setstate(std::ios_base::failbit);
  }

  this->CloseCompileCommandsStream();
  this->CloseRulesFileStream();
  this->CloseBuildFileStream();
}